

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::insert(CBString *this,int pos,CBString *b,uchar cfill)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  iVar1 = binsert(&this->super_tagbstring,pos,&b->super_tagbstring,cfill);
  if (iVar1 != -1) {
    return;
  }
  std::__cxx11::string::string((string *)&local_58,"CBString::Failure in insert",&local_59);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::insert (int pos, const CBString& b, unsigned char cfill) {
	if (BSTR_ERR == binsert (this, pos, (bstring) &b, cfill)) {
		bstringThrow ("Failure in insert");
	}
}